

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int add_int(int_list *ilist,int val)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = ilist->len;
  if ((long)iVar1 == 0) {
    ilist->list = (int *)0x0;
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = ilist->list;
  }
  ilist->len = iVar1 + 1;
  piVar2 = (int *)realloc(piVar2,(long)iVar1 * 4 + 4);
  ilist->list = piVar2;
  if (piVar2 == (int *)0x0) {
    fprintf(_stderr,"** failed to alloc %d (int *) elements\n",(ulong)(uint)ilist->len);
    iVar1 = -1;
  }
  else {
    piVar2[(long)ilist->len + -1] = val;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int add_int(int_list * ilist, int val)
{
   if( ilist->len == 0 ) ilist->list = NULL;  /* just to be safe */
   ilist->len++;
   ilist->list = (int *)realloc(ilist->list,ilist->len*sizeof(int));
   if( ! ilist->list ){
      fprintf(stderr,"** failed to alloc %d (int *) elements\n",ilist->len);
      return -1;
   }

   ilist->list[ilist->len-1] = val;

   return 0;
}